

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O0

float __thiscall KV::KeyValues::getValueAsFloat(KeyValues *this,float defaultVal)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  exception *anon_var_0;
  float defaultVal_local;
  KeyValues *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->value);
  this_local._4_4_ = defaultVal;
  if (bVar1) {
    __str = std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value(&this->value);
    this_local._4_4_ = std::__cxx11::stof(__str,(size_t *)0x0);
  }
  return this_local._4_4_;
}

Assistant:

float KeyValues::getValueAsFloat( float defaultVal /*= 0.0f*/ ) const
	{
		if ( !value )
			return defaultVal;

		try
		{
			return std::stof( value.value() );
		}
		catch ( const std::exception& )
		{
			return defaultVal;
		}
	}